

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O1

SquareMatrix<double> __thiscall
qclab::QCircuit<double,_qclab::QObject<double>_>::matrix
          (QCircuit<double,_qclab::QObject<double>_> *this)

{
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> extraout_RDX;
  long in_RSI;
  undefined8 *puVar2;
  SquareMatrix<double> SVar3;
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> _Var1;
  
  SVar3 = dense::eye<double>((dense *)this,(long)(1 << (*(byte *)(in_RSI + 0xc) & 0x1f)));
  _Var1._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (tuple<double_*,_std::default_delete<double[]>_>)
       SVar3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  for (puVar2 = *(undefined8 **)(in_RSI + 0x18); puVar2 != *(undefined8 **)(in_RSI + 0x20);
      puVar2 = puVar2 + 1) {
    (**(code **)(*(long *)*puVar2 + 0x48))
              ((long *)*puVar2,0x52,0x4e,*(undefined4 *)(in_RSI + 0xc),this,0);
    _Var1._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         extraout_RDX._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
  }
  SVar3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       _Var1._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
        auto mat = qclab::dense::eye< T >( 1 << nbQubits_ ) ;
        for ( auto it = begin(); it != end(); ++it ) {
          (*it)->apply( Side::Right , Op::NoTrans , nbQubits_ , mat ) ;
        }
        return mat ;
      }